

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O2

void InitNet(void)

{
  float fVar1;
  longlong lVar2;
  real *prVar3;
  long lVar4;
  longlong lVar5;
  long lVar6;
  long lVar7;
  ushort uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  posix_memalign(&syn0,0x80,vocab_size * layer1_size * 4);
  if (syn0 != (real *)0x0) {
    lVar5 = vocab_size;
    if (hs != 0) {
      posix_memalign(&syn1,0x80,vocab_size * layer1_size * 4);
      lVar5 = vocab_size;
      lVar2 = layer1_size;
      if (syn1 == (real *)0x0) goto LAB_00103122;
      lVar6 = 0;
      lVar4 = 0;
      if (0 < layer1_size) {
        lVar4 = layer1_size;
      }
      prVar3 = syn1;
      lVar7 = 0;
      if (0 < vocab_size) {
        lVar7 = vocab_size;
      }
      for (; lVar6 != lVar7; lVar6 = lVar6 + 1) {
        for (lVar9 = 0; lVar4 != lVar9; lVar9 = lVar9 + 1) {
          prVar3[lVar9] = 0.0;
        }
        prVar3 = prVar3 + lVar2;
      }
    }
    if (negative < 1) {
      lVar4 = 0;
      if (0 < lVar5) {
        lVar4 = lVar5;
      }
    }
    else {
      posix_memalign(&syn1neg,0x80,lVar5 * layer1_size * 4);
      lVar5 = layer1_size;
      if (syn1neg == (real *)0x0) goto LAB_00103122;
      lVar7 = 0;
      lVar6 = 0;
      if (0 < layer1_size) {
        lVar6 = layer1_size;
      }
      prVar3 = syn1neg;
      lVar4 = vocab_size;
      if (vocab_size < 1) {
        lVar4 = lVar7;
      }
      for (; lVar7 != lVar4; lVar7 = lVar7 + 1) {
        for (lVar9 = 0; lVar6 != lVar9; lVar9 = lVar9 + 1) {
          prVar3[lVar9] = 0.0;
        }
        prVar3 = prVar3 + lVar5;
      }
    }
    fVar1 = (float)layer1_size;
    lVar7 = 0;
    lVar6 = 0;
    if (0 < layer1_size) {
      lVar6 = layer1_size;
    }
    lVar9 = layer1_size * 4;
    uVar8 = 1;
    for (lVar10 = 0; prVar3 = syn0, lVar10 != lVar4; lVar10 = lVar10 + 1) {
      for (lVar11 = 0; lVar6 != lVar11; lVar11 = lVar11 + 1) {
        uVar8 = uVar8 * -0x1993 + 0xb;
        *(float *)((long)prVar3 + lVar11 * 4 + lVar7) =
             ((float)uVar8 * 1.5258789e-05 + -0.5) / fVar1;
      }
      lVar7 = lVar7 + lVar9;
    }
    CreateBinaryTree();
    return;
  }
LAB_00103122:
  puts("Memory allocation failed");
  exit(1);
}

Assistant:

void InitNet() {
  long long a, b;
  unsigned long long next_random = 1;
  a = posix_memalign((void **)&syn0, 128, (long long)vocab_size * layer1_size * sizeof(real));
  if (syn0 == NULL) {printf("Memory allocation failed\n"); exit(1);}
  if (hs) {
    a = posix_memalign((void **)&syn1, 128, (long long)vocab_size * layer1_size * sizeof(real));
    if (syn1 == NULL) {printf("Memory allocation failed\n"); exit(1);}
    for (a = 0; a < vocab_size; a++) for (b = 0; b < layer1_size; b++)
     syn1[a * layer1_size + b] = 0;
  }
  if (negative>0) {
    a = posix_memalign((void **)&syn1neg, 128, (long long)vocab_size * layer1_size * sizeof(real));
    if (syn1neg == NULL) {printf("Memory allocation failed\n"); exit(1);}
    for (a = 0; a < vocab_size; a++) for (b = 0; b < layer1_size; b++)
     syn1neg[a * layer1_size + b] = 0;
  }
  for (a = 0; a < vocab_size; a++) for (b = 0; b < layer1_size; b++) {
    next_random = next_random * (unsigned long long)25214903917 + 11;
    syn0[a * layer1_size + b] = (((next_random & 0xFFFF) / (real)65536) - 0.5) / layer1_size;
  }
  CreateBinaryTree();
}